

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,uint32_t size)

{
  PortPackedStruct *pPVar1;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t local_38;
  allocator_type local_31;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,&local_31);
  pPVar1 = port_packed(this,direction,port_name,packed_struct_,&local_50);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pPVar1;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         uint32_t size) {
    return port_packed(direction, port_name, packed_struct_, std::vector<uint32_t>{size});
}